

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O0

void __thiscall mp::BucketAccumulator<mp::EExpr>::Add(BucketAccumulator<mp::EExpr> *this,EExpr *ee)

{
  QuadAndLinTerms *pQVar1;
  QuadTerms *pQVar2;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_RSI;
  long in_RDI;
  double dVar3;
  QuadTerms *in_stack_000000b8;
  BucketAccum1Type<mp::QuadTerms> *in_stack_000000c0;
  LinTerms *in_stack_fffffffffffffdf8;
  LinTerms *in_stack_fffffffffffffe00;
  QuadTerms *this_00;
  LinTerms *in_stack_ffffffffffffff28;
  BucketAccum1Type<mp::LinTerms> *in_stack_ffffffffffffff30;
  
  dVar3 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(in_RSI);
  *(double *)(in_RDI + 0x6e00) = *(double *)(in_RDI + 0x6e00) + dVar3;
  pQVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::GetBody(in_RSI);
  QuadAndLinTerms::GetLinTerms(pQVar1);
  LinTerms::LinTerms(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  BucketAccum1Type<mp::LinTerms>::Add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  LinTerms::~LinTerms(in_stack_fffffffffffffe00);
  pQVar2 = (QuadTerms *)(in_RDI + 0x1e00);
  pQVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::GetBody(in_RSI);
  QuadAndLinTerms::GetQPTerms(pQVar1);
  this_00 = (QuadTerms *)&stack0xfffffffffffffe28;
  QuadTerms::QuadTerms(this_00,pQVar2);
  BucketAccum1Type<mp::QuadTerms>::Add(in_stack_000000c0,in_stack_000000b8);
  QuadTerms::~QuadTerms(this_00);
  return;
}

Assistant:

void BucketAccumulator<EExprLike>::Add(EExprLike ee) {
  ct_ += ee.constant_term();
  ba_l_.Add(std::move(ee.GetBody().GetLinTerms()));
  ba_q_.Add(std::move(ee.GetBody().GetQPTerms()));
}